

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slab_cache.c
# Opt level: O3

void slab_put_with_order(slab_cache *cache,slab *slab)

{
  small_stats *psVar1;
  uint uVar2;
  size_t *psVar3;
  byte bVar4;
  byte bVar5;
  rlist *prVar6;
  rlist *prVar7;
  slab_arena *arena;
  slab *psVar8;
  byte bVar9;
  slab *psVar10;
  
  slab_assert(cache,slab);
  bVar9 = slab->order;
  bVar4 = cache->order_max;
  if (bVar4 < bVar9) {
    __assert_fail("slab->order <= cache->order_max",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/slab_cache.c"
                  ,0x14e,"void slab_put_with_order(struct slab_cache *, struct slab *)");
  }
  if (bVar9 + 1 != (uint)slab->in_use) {
    __assert_fail("slab->in_use == slab->order + 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/slab_cache.c"
                  ,0x53,"void slab_set_free(struct slab_cache *, struct slab *)");
  }
  psVar10 = (slab *)slab->size;
  psVar1 = &(cache->allocated).stats;
  psVar1->used = psVar1->used - (long)psVar10;
  psVar1 = &cache->orders[bVar9].stats;
  psVar1->used = psVar1->used - (long)psVar10;
  slab->in_use = '\0';
  if (bVar9 != bVar4) {
    bVar5 = cache->order0_size_lb;
    uVar2 = (uint)bVar9 + (uint)bVar5;
    if ((((slab *)(1L << ((byte)uVar2 & 0x3f)) != slab) &&
        (psVar8 = (slab *)((ulong)slab ^ 1L << ((ulong)uVar2 & 0x3f)), psVar8->order == bVar9)) &&
       (psVar8->in_use == '\0')) {
      psVar3 = &cache->orders[bVar9].stats.total;
      *psVar3 = *psVar3 - (long)psVar10;
      do {
        if (bVar4 < bVar9) {
          __assert_fail("slab->order <= cache->order_max",
                        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/slab_cache.c"
                        ,0x82,"struct slab *slab_buddy(struct slab_cache *, struct slab *)");
        }
        psVar10 = (slab *)((ulong)slab ^ 1L << ((ulong)((uint)bVar5 + (uint)bVar9) & 0x3f));
        if (bVar9 == bVar4) {
          psVar10 = (slab *)0x0;
        }
        if (psVar10 != psVar8) {
          __assert_fail("slab_buddy(cache, slab) == buddy",
                        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/slab_cache.c"
                        ,0x9f,
                        "struct slab *slab_merge(struct slab_cache *, struct slab *, struct slab *)"
                       );
        }
        if (psVar8 < slab) {
          slab = psVar8;
        }
        prVar6 = (psVar8->next_in_list).prev;
        prVar7 = (psVar8->next_in_list).next;
        prVar6->next = prVar7;
        prVar7->prev = prVar6;
        (psVar8->next_in_list).next = &psVar8->next_in_list;
        (psVar8->next_in_list).prev = &psVar8->next_in_list;
        psVar3 = &cache->orders[bVar9].stats.total;
        *psVar3 = *psVar3 - psVar8->size;
        bVar9 = slab->order + 1;
        slab->order = bVar9;
        if (bVar4 < bVar9) {
          __assert_fail("order <= cache->order_max",
                        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/slab_cache.h"
                        ,0xee,"intptr_t slab_order_size(struct slab_cache *, uint8_t)");
        }
        psVar10 = (slab *)(1L << (bVar5 + bVar9 & 0x3f));
        slab->size = (size_t)psVar10;
      } while (((bVar9 != bVar4) && (psVar10 != slab)) &&
              ((psVar8 = (slab *)((ulong)psVar10 ^ (ulong)slab), psVar8->order == bVar9 &&
               (psVar8->in_use == '\0'))));
      psVar3 = &cache->orders[bVar9].stats.total;
      *psVar3 = (long)&(psVar10->next_in_cache).prev + *psVar3;
    }
  }
  memset(slab + 1,0x50,(size_t)(psVar10 + -1));
  if (bVar9 == cache->order_max) {
    prVar6 = cache->orders[bVar9].slabs.next;
    if ((prVar6 != &cache->orders[bVar9].slabs) || (prVar6 != cache->orders[bVar9].slabs.prev)) {
      arena = cache->arena;
      if (psVar10 == (slab *)(ulong)arena->slab_size) {
        prVar6 = (slab->next_in_cache).prev;
        prVar7 = (slab->next_in_cache).next;
        prVar6->next = prVar7;
        prVar7->prev = prVar6;
        (slab->next_in_cache).next = &slab->next_in_cache;
        (slab->next_in_cache).prev = &slab->next_in_cache;
        psVar3 = &(cache->allocated).stats.total;
        *psVar3 = *psVar3 - (long)psVar10;
        psVar3 = &cache->orders[bVar9].stats.total;
        *psVar3 = *psVar3 - (long)psVar10;
        slab_unmap(arena,slab);
        return;
      }
      __assert_fail("slab->size == cache->arena->slab_size",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/slab_cache.c"
                    ,0x170,"void slab_put_with_order(struct slab_cache *, struct slab *)");
    }
  }
  (slab->next_in_list).prev = &cache->orders[bVar9].slabs;
  (slab->next_in_list).next = cache->orders[bVar9].slabs.next;
  cache->orders[bVar9].slabs.next = &slab->next_in_list;
  ((slab->next_in_list).next)->prev = &slab->next_in_list;
  return;
}

Assistant:

void
slab_put_with_order(struct slab_cache *cache, struct slab *slab)
{
	slab_assert(cache, slab);
	assert(slab->order <= cache->order_max);
	/* An "ordered" slab is returned to the cache. */
	slab_set_free(cache, slab);
	struct slab *buddy = slab_buddy(cache, slab);
	/*
	 * The buddy slab could also have been split into a pair
	 * of smaller slabs, the first of which happens to be
	 * free. To not merge with a slab which is in fact
	 * partially occupied, first check that slab orders match.
	 *
	 * A slab is not accounted in "used" or "total" counters
	 * if it was split into slabs of a lower order.
	 * cache->orders statistics only contains sizes of either
	 * slabs returned by slab_get, or present in the free
	 * list. This ensures that sums of cache->orders[i].stats
	 * match the totals in cache->allocated.stats.
	 */
	if (buddy && buddy->order == slab->order && slab_is_free(buddy)) {
		cache->orders[slab->order].stats.total -= slab->size;
		do {
			slab = slab_merge(cache, slab, buddy);
			buddy = slab_buddy(cache, slab);
		} while (buddy && buddy->order == slab->order &&
			 slab_is_free(buddy));
		cache->orders[slab->order].stats.total += slab->size;
	}
	slab_poison(slab);
	if (slab->order == cache->order_max &&
	    !rlist_empty(&cache->orders[slab->order].slabs)) {
		/*
		 * Largest slab should be returned to arena, but we do so
		 * only if the slab cache has at least one slab of that size
		 * in order to avoid oscillations.
		 */
		assert(slab->size == cache->arena->slab_size);
		slab_list_del(&cache->allocated, slab, next_in_cache);
		cache->orders[slab->order].stats.total -= slab->size;
		slab_unmap(cache->arena, slab);
	} else {
		/* Put the slab to the cache */
		rlist_add_entry(&cache->orders[slab->order].slabs, slab,
				next_in_list);
	}
}